

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O0

HPDF_Annotation
HPDF_Page_CreateStampAnnot
          (HPDF_Page page,HPDF_Rect rect,HPDF_StampAnnotName name,char *text,HPDF_Encoder encoder)

{
  HPDF_BOOL HVar1;
  HPDF_STATUS HVar2;
  HPDF_Annotation local_50;
  HPDF_Annotation annot;
  HPDF_PageAttr attr;
  HPDF_Encoder encoder_local;
  char *text_local;
  HPDF_StampAnnotName name_local;
  HPDF_Page page_local;
  HPDF_Rect rect_local;
  
  HVar1 = HPDF_Page_Validate(page);
  if (HVar1 == 0) {
    rect_local.right = 0.0;
    rect_local.top = 0.0;
  }
  else {
    local_50 = HPDF_StampAnnot_New(page->mmgr,*(HPDF_Xref_conflict *)((long)page->attr + 0x78),rect,
                                   name,text,encoder);
    if (local_50 == (HPDF_Annotation)0x0) {
      HPDF_CheckError(page->error);
    }
    else {
      HVar2 = AddAnnotation(page,local_50);
      if (HVar2 != 0) {
        HPDF_CheckError(page->error);
        local_50 = (HPDF_Annotation)0x0;
      }
    }
    rect_local._8_8_ = local_50;
  }
  return (HPDF_Annotation)rect_local._8_8_;
}

Assistant:

HPDF_EXPORT(HPDF_Annotation)
HPDF_Page_CreateStampAnnot  (    HPDF_Page          page,
                                HPDF_Rect           rect,
                                HPDF_StampAnnotName name,
                                const char*         text,
                                HPDF_Encoder        encoder)
{
    HPDF_PageAttr attr;
    HPDF_Annotation annot;

    HPDF_PTRACE((" HPDF_Page_CreateStampAnnot\n"));

    if (!HPDF_Page_Validate (page))
        return NULL;

    attr = (HPDF_PageAttr)page->attr;

    annot = HPDF_StampAnnot_New ( page->mmgr, attr->xref, rect, name, text, encoder);
    if (annot) {
        if (AddAnnotation (page, annot) != HPDF_OK) {
            HPDF_CheckError (page->error);
            annot = NULL;
        }
    } else
        HPDF_CheckError (page->error);

    return annot;
}